

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

size_t license::mstrlcpy(char *dst,char *src,size_t n)

{
  ulong uVar1;
  long lVar2;
  size_t n_orig;
  
  if (n == 0) {
    lVar2 = 0;
  }
  else {
    for (uVar1 = 0; (n - 1 != uVar1 && (src[uVar1] != '\0')); uVar1 = uVar1 + 1) {
      dst[uVar1] = src[uVar1];
    }
    dst[uVar1] = '\0';
    lVar2 = ~uVar1 + n;
  }
  return n - lVar2;
}

Assistant:

size_t mstrlcpy(char *dst, const char *src, size_t n) {
	size_t n_orig = n;
	if (n > 0) {
		char *pd;
		const char *ps;

		for (--n, pd = dst, ps = src; n > 0 && *ps != '\0'; --n, ++pd, ++ps) *pd = *ps;

		*pd = '\0';
	}

	return n_orig - n;
}